

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void address_space_dispatch_free_mipsel(AddressSpaceDispatch *d)

{
  MemoryRegion *mem;
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(d->map).sections_nb;
  while ((int)uVar2 != 0) {
    uVar1 = (int)uVar2 - 1;
    uVar2 = (ulong)uVar1;
    (d->map).sections_nb = uVar1;
    mem = (d->map).sections[uVar2].mr;
    if (mem->subpage == true) {
      g_free(mem);
      uVar2 = (ulong)(d->map).sections_nb;
    }
  }
  g_free((d->map).sections);
  g_free((d->map).nodes);
  g_free(d);
  return;
}

Assistant:

void address_space_dispatch_free(AddressSpaceDispatch *d)
{
    phys_sections_free(&d->map);
    g_free(d);
}